

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcItemWidth(void)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  float width_to_right_edge;
  float w;
  ImGuiWindow *window;
  float local_18;
  float local_c;
  
  pIVar1 = GetCurrentWindowRead();
  local_c = (pIVar1->DC).ItemWidth;
  if (local_c < 0.0) {
    IVar2 = GetContentRegionAvail();
    local_18 = IVar2.x;
    local_c = ImMax<float>(1.0,local_18 + local_c);
  }
  return (float)(int)local_c;
}

Assistant:

float ImGui::CalcItemWidth()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    float w = window->DC.ItemWidth;
    if (w < 0.0f)
    {
        // Align to a right-side limit. We include 1 frame padding in the calculation because this is how the width is always used (we add 2 frame padding to it), but we could move that responsibility to the widget as well.
        float width_to_right_edge = GetContentRegionAvail().x;
        w = ImMax(1.0f, width_to_right_edge + w);
    }
    w = (float)(int)w;
    return w;
}